

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O1

void Cec_ManPatPrintStats(Cec_ManPat_t *p)

{
  long lVar1;
  long lVar2;
  int level;
  double dVar3;
  
  level = (int)p;
  Abc_Print(level,"Latest: P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n",
            (double)p->nPatLitsMin / (double)p->nPats,
            (double)(p->vStorage->nSize - p->iStart) * 9.5367431640625e-07,(ulong)(uint)p->nPats,
            (ulong)(uint)p->nPatLits);
  Abc_Print(level,"Total:  P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n",
            (double)p->nPatLitsMinAll / (double)p->nPatsAll,
            (double)p->vStorage->nSize * 9.5367431640625e-07,(ulong)(uint)p->nPatsAll,
            (ulong)(uint)p->nPatLitsAll);
  lVar1 = p->timeTotal;
  lVar2 = p->timeFind;
  Abc_Print(level,"%s =","Finding  ");
  dVar3 = 0.0;
  if (lVar1 != 0) {
    dVar3 = ((double)lVar2 * 100.0) / (double)lVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar2 / 1000000.0,dVar3);
  lVar1 = p->timeTotal;
  lVar2 = p->timeShrink;
  Abc_Print(level,"%s =","Shrinking");
  dVar3 = 0.0;
  if (lVar1 != 0) {
    dVar3 = ((double)lVar2 * 100.0) / (double)lVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar2 / 1000000.0,dVar3);
  lVar1 = p->timeTotal;
  lVar2 = p->timeVerify;
  Abc_Print(level,"%s =","Verifying");
  dVar3 = 0.0;
  if (lVar1 != 0) {
    dVar3 = ((double)lVar2 * 100.0) / (double)lVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar2 / 1000000.0,dVar3);
  lVar1 = p->timeTotal;
  lVar2 = p->timeSort;
  Abc_Print(level,"%s =","Sorting  ");
  dVar3 = 0.0;
  if (lVar1 != 0) {
    dVar3 = ((double)lVar2 * 100.0) / (double)lVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar2 / 1000000.0,dVar3);
  lVar1 = p->timeTotal;
  lVar2 = p->timePack;
  Abc_Print(level,"%s =","Packing  ");
  dVar3 = 0.0;
  if (lVar1 != 0) {
    dVar3 = ((double)lVar2 * 100.0) / (double)lVar1;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)lVar2 / 1000000.0,dVar3);
  lVar1 = p->timeTotal;
  Abc_Print(level,"%s =","TOTAL    ");
  Abc_Print(level,"%9.2f sec\n",(double)lVar1 / 1000000.0);
  return;
}

Assistant:

void Cec_ManPatPrintStats( Cec_ManPat_t * p )  
{ 
    Abc_Print( 1, "Latest: P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n", 
        p->nPats, p->nPatLits, p->nPatLitsMin, 1.0 * p->nPatLitsMin/p->nPats, 
        1.0*(Vec_StrSize(p->vStorage)-p->iStart)/(1<<20) );
    Abc_Print( 1, "Total:  P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n", 
        p->nPatsAll, p->nPatLitsAll, p->nPatLitsMinAll, 1.0 * p->nPatLitsMinAll/p->nPatsAll, 
        1.0*Vec_StrSize(p->vStorage)/(1<<20) );
    Abc_PrintTimeP( 1, "Finding  ", p->timeFind,   p->timeTotal );
    Abc_PrintTimeP( 1, "Shrinking", p->timeShrink, p->timeTotal );
    Abc_PrintTimeP( 1, "Verifying", p->timeVerify, p->timeTotal );
    Abc_PrintTimeP( 1, "Sorting  ", p->timeSort,   p->timeTotal );
    Abc_PrintTimeP( 1, "Packing  ", p->timePack,   p->timeTotal );
    Abc_PrintTime( 1, "TOTAL    ",  p->timeTotal );
}